

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomShaderTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::anon_unknown_1::TextureGroup::init(TextureGroup *this,EVP_PKEY_CTX *ctx)

{
  TestNode *node;
  TestNode *node_00;
  undefined8 extraout_RAX;
  RandomShaderCase *pRVar1;
  undefined8 extraout_RAX_00;
  undefined8 uVar2;
  undefined8 extraout_RAX_01;
  int seed;
  deUint32 dVar3;
  ProgramParameters params;
  
  rsg::ProgramParameters::ProgramParameters(&params);
  params.useScalarConversions = true;
  params.useSwizzle = true;
  params.vertexParameters.texLookupBaseWeight = 10.0;
  params.vertexParameters.useTexture2D = true;
  params.vertexParameters.useTextureCube = true;
  params.fragmentParameters.texLookupBaseWeight = 10.0;
  params.fragmentParameters.useTexture2D = true;
  params.fragmentParameters.useTextureCube = true;
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"vertex",
             "Vertex-only tests");
  tcu::TestNode::addChild((TestNode *)this,node);
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fragment",
             "Fragment-only tests");
  tcu::TestNode::addChild((TestNode *)this,node_00);
  uVar2 = extraout_RAX;
  for (dVar3 = 0; dVar3 != 0x32; dVar3 = dVar3 + 1) {
    pRVar1 = createRandomShaderCase
                       ((this->super_TestCaseGroup).m_context,"Texture lookups in vertex shader",
                        &params,dVar3,true,false);
    tcu::TestNode::addChild(node,(TestNode *)pRVar1);
    uVar2 = extraout_RAX_00;
  }
  for (dVar3 = 0; dVar3 != 0x96; dVar3 = dVar3 + 1) {
    pRVar1 = createRandomShaderCase
                       ((this->super_TestCaseGroup).m_context,"Texture lookups in fragment shader",
                        &params,dVar3,false,true);
    tcu::TestNode::addChild(node_00,(TestNode *)pRVar1);
    uVar2 = extraout_RAX_01;
  }
  return (int)uVar2;
}

Assistant:

void init (void)
	{
		rsg::ProgramParameters params;
		params.useScalarConversions						= true;
		params.useSwizzle								= true;
		params.vertexParameters.texLookupBaseWeight		= 10.0f;
		params.vertexParameters.useTexture2D			= true;
		params.vertexParameters.useTextureCube			= true;
		params.fragmentParameters.texLookupBaseWeight	= 10.0f;
		params.fragmentParameters.useTexture2D			= true;
		params.fragmentParameters.useTextureCube		= true;

		tcu::TestCaseGroup* vertexGroup = new tcu::TestCaseGroup(m_testCtx, "vertex", "Vertex-only tests");
		addChild(vertexGroup);

		tcu::TestCaseGroup* fragmentGroup = new tcu::TestCaseGroup(m_testCtx, "fragment", "Fragment-only tests");
		addChild(fragmentGroup);

		// Do only 50 vertex cases and 150 fragment cases.
		for (int seed = 0; seed < 50; seed++)
			vertexGroup->addChild(createRandomShaderCase(m_context,		"Texture lookups in vertex shader",		params, seed, true, false));

		for (int seed = 0; seed < 150; seed++)
			fragmentGroup->addChild(createRandomShaderCase(m_context,	"Texture lookups in fragment shader",	params, seed, false, true));
	}